

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O2

OffsetDataList * __thiscall
QTimeZone::transitions
          (OffsetDataList *__return_storage_ptr__,QTimeZone *this,QDateTime *fromDateTime,
          QDateTime *toDateTime)

{
  QTimeZonePrivate *this_00;
  Data *pDVar1;
  OffsetData *pOVar2;
  qsizetype qVar3;
  bool bVar4;
  qint64 fromMSecsSinceEpoch;
  qint64 toMSecsSinceEpoch;
  long lVar5;
  Data *data;
  long in_FS_OFFSET;
  QArrayDataPointer<QTimeZonePrivate::Data> local_98;
  QArrayDataPointer<QTimeZone::OffsetData> local_78;
  OffsetData local_60;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.size = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (OffsetData *)0x0;
  if (((ulong)(this->d).d & 3) == 0) {
    bVar4 = hasTransitions(this);
    if (bVar4) {
      local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_98.ptr = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      this_00 = (this->d).d;
      fromMSecsSinceEpoch = QDateTime::toMSecsSinceEpoch(fromDateTime);
      toMSecsSinceEpoch = QDateTime::toMSecsSinceEpoch(toDateTime);
      QTimeZonePrivate::transitions
                ((DataList *)&local_98,this_00,fromMSecsSinceEpoch,toMSecsSinceEpoch);
      QList<QTimeZone::OffsetData>::reserve((QList<QTimeZone::OffsetData> *)&local_78,local_98.size)
      ;
      data = local_98.ptr;
      for (lVar5 = local_98.size * 0x30; lVar5 != 0; lVar5 = lVar5 + -0x30) {
        QTimeZonePrivate::toOffsetData(&local_60,data);
        QList<QTimeZone::OffsetData>::emplaceBack<QTimeZone::OffsetData>
                  ((QList<QTimeZone::OffsetData> *)&local_78,&local_60);
        OffsetData::~OffsetData(&local_60);
        data = data + 1;
      }
      QArrayDataPointer<QTimeZonePrivate::Data>::~QArrayDataPointer(&local_98);
    }
  }
  else if (((int)(this->d).d - 1U & 3) == 0) {
    systemTimeZone();
    transitions(__return_storage_ptr__,(QTimeZone *)&local_60,fromDateTime,toDateTime);
    ~QTimeZone((QTimeZone *)&local_60);
    goto LAB_003165ec;
  }
  qVar3 = local_78.size;
  pOVar2 = local_78.ptr;
  pDVar1 = local_78.d;
  local_78.d = (Data *)0x0;
  local_78.ptr = (OffsetData *)0x0;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = pOVar2;
  local_78.size = 0;
  (__return_storage_ptr__->d).size = qVar3;
LAB_003165ec:
  QArrayDataPointer<QTimeZone::OffsetData>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QTimeZone::OffsetDataList QTimeZone::transitions(const QDateTime &fromDateTime,
                                                 const QDateTime &toDateTime) const
{
    OffsetDataList list;
    if (d.isShort()) {
        switch (d.s.spec()) {
        case Qt::LocalTime:
            return systemTimeZone().transitions(fromDateTime, toDateTime);
        case Qt::UTC:
        case Qt::OffsetFromUTC:
            break;
        case Qt::TimeZone:
            Q_UNREACHABLE();
            break;
        }
    } else if (hasTransitions()) {
        const QTimeZonePrivate::DataList plist = d->transitions(fromDateTime.toMSecsSinceEpoch(),
                                                                toDateTime.toMSecsSinceEpoch());
        list.reserve(plist.size());
        for (const QTimeZonePrivate::Data &pdata : plist)
            list.append(QTimeZonePrivate::toOffsetData(pdata));
    }
    return list;
}